

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_gzip.c
# Opt level: O2

void test_compat_gzip(void)

{
  uchar *in_RCX;
  size_t in_RDX;
  size_t siglen;
  uchar *in_RSI;
  size_t in_R8;
  
  verify((EVP_PKEY_CTX *)"test_compat_gzip_1.tgz",in_RSI,in_RDX,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_compat_gzip_2.tgz",in_RSI,siglen,in_RCX,in_R8);
  return;
}

Assistant:

DEFINE_TEST(test_compat_gzip)
{
	/* This sample has been 'split', each piece compressed separately,
	 * then concatenated.  Gunzip will emit the concatenated result. */
	/* Not supported in libarchive 2.6 and earlier */
	verify("test_compat_gzip_1.tgz");
	/* This sample has been compressed as a single stream, but then
	 * some unrelated garbage text has been appended to the end. */
	verify("test_compat_gzip_2.tgz");
}